

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

void __thiscall
slang::syntax::TypeReferenceSyntax::setChild
          (TypeReferenceSyntax *this,size_t index,TokenOrSyntax child)

{
  (*(code *)(&DAT_00420038 + *(int *)(&DAT_00420038 + index * 4)))();
  return;
}

Assistant:

void TypeReferenceSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: typeKeyword = child.token(); return;
        case 1: openParen = child.token(); return;
        case 2: expr = child.node() ? &child.node()->as<ExpressionSyntax>() : nullptr; return;
        case 3: closeParen = child.token(); return;
        default: SLANG_UNREACHABLE;
    }
}